

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseTerminalType(ParseContext *ctx,bool *shrBorrow)

{
  Lexeme *begin;
  IntrusiveList<SynIdentifier> path;
  IntrusiveList<SynBase> types_00;
  IntrusiveList<SynIdentifier> path_00;
  bool bVar1;
  bool bVar2;
  LexemeType LVar3;
  uint uVar4;
  SynBase *pSVar5;
  SynTypeSimple *this;
  SynTypeof *this_00;
  SynIdentifier *pSVar6;
  Lexeme *pLVar7;
  Lexeme *pLVar8;
  InplaceStr name_00;
  SynIdentifier *nameIdentifier;
  InplaceStr name_1;
  SynBase *node;
  SynBase *value;
  bool local_a9;
  bool closed;
  SynBase *type;
  IntrusiveList<SynBase> types;
  SynNamespaceElement *local_50;
  SynNamespaceElement *ns;
  IntrusiveList<SynIdentifier> namespacePath;
  InplaceStr name;
  Lexeme *start;
  bool *shrBorrow_local;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::At(ctx,lex_string);
  if (bVar1) {
    join_0x00000010_0x00000000_ = ParseContext::Consume(ctx);
    IntrusiveList<SynIdentifier>::IntrusiveList((IntrusiveList<SynIdentifier> *)&ns);
    local_50 = (SynNamespaceElement *)0x0;
    while( true ) {
      bVar2 = ParseContext::At(ctx,lex_point);
      bVar1 = false;
      if (bVar2) {
        local_50 = ParseContext::IsNamespace(ctx,local_50,stack0xffffffffffffffc8);
        bVar1 = local_50 != (SynNamespaceElement *)0x0;
      }
      if (!bVar1) goto LAB_00117758;
      ParseContext::Skip(ctx);
      bVar1 = anon_unknown.dwarf_fc7e::CheckAt
                        (ctx,lex_string,"ERROR: namespace member is expected after \'.\'");
      if (!bVar1) break;
      pSVar6 = ParseContext::get<SynIdentifier>(ctx);
      pLVar7 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(pSVar6,begin,pLVar7,stack0xffffffffffffffc8);
      IntrusiveList<SynIdentifier>::push_back((IntrusiveList<SynIdentifier> *)&ns,pSVar6);
      join_0x00000010_0x00000000_ = ParseContext::Consume(ctx);
      unique0x100006ff = join_0x00000010_0x00000000_;
    }
    pSVar6 = ParseContext::get<SynIdentifier>(ctx);
    pLVar7 = ParseContext::Previous(ctx);
    SynIdentifier::SynIdentifier(pSVar6,begin,pLVar7,stack0xffffffffffffffc8);
    IntrusiveList<SynIdentifier>::push_back((IntrusiveList<SynIdentifier> *)&ns,pSVar6);
LAB_00117758:
    bVar1 = ParseContext::Consume(ctx,lex_less);
    if (bVar1) {
      IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)&type);
      pSVar5 = ParseType(ctx,shrBorrow,false);
      if (pSVar5 == (SynBase *)0x0) {
        LVar3 = ParseContext::Peek(ctx);
        if (LVar3 == lex_greater) {
          pLVar7 = ParseContext::Current(ctx);
          anon_unknown.dwarf_fc7e::Report(ctx,pLVar7,"ERROR: typename required after \'<\'");
        }
        ctx->currentLexeme = begin;
        ctx_local = (ParseContext *)0x0;
      }
      else {
        IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&type,pSVar5);
        while (bVar1 = ParseContext::Consume(ctx,lex_comma), bVar1) {
          pSVar5 = ParseType(ctx,shrBorrow,false);
          if (pSVar5 == (SynBase *)0x0) {
            pLVar7 = ParseContext::Current(ctx);
            anon_unknown.dwarf_fc7e::Report(ctx,pLVar7,"ERROR: typename required after \',\'");
            break;
          }
          IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&type,pSVar5);
        }
        local_a9 = ParseContext::Consume(ctx,lex_greater);
        if ((!local_a9) && (bVar1 = ParseContext::At(ctx,lex_shr), bVar1)) {
          if ((*shrBorrow & 1U) != 0) {
            ParseContext::Skip(ctx);
          }
          *shrBorrow = (bool)((*shrBorrow ^ 0xffU) & 1);
          local_a9 = true;
        }
        if (local_a9 == false) {
          uVar4 = IntrusiveList<SynBase>::size((IntrusiveList<SynBase> *)&type);
          if (uVar4 < 2) {
            ctx->currentLexeme = begin;
            return (SynBase *)0x0;
          }
          pLVar7 = ParseContext::Current(ctx);
          anon_unknown.dwarf_fc7e::Report
                    (ctx,pLVar7,"ERROR: \'>\' expected after generic type alias list");
        }
        ctx_local = (ParseContext *)ParseContext::get<SynTypeGenericInstance>(ctx);
        pLVar7 = ParseContext::Previous(ctx);
        this = ParseContext::get<SynTypeSimple>(ctx);
        pLVar8 = ParseContext::Previous(ctx);
        path_00.tail = namespacePath.head;
        path_00.head = (SynIdentifier *)ns;
        SynTypeSimple::SynTypeSimple(this,begin,pLVar8,path_00,stack0xffffffffffffffc8);
        types_00.tail = types.head;
        types_00.head = type;
        SynTypeGenericInstance::SynTypeGenericInstance
                  ((SynTypeGenericInstance *)ctx_local,begin,pLVar7,&this->super_SynBase,types_00);
      }
    }
    else {
      ctx_local = (ParseContext *)ParseContext::get<SynTypeSimple>(ctx);
      pLVar7 = ParseContext::Previous(ctx);
      path.tail = namespacePath.head;
      path.head = (SynIdentifier *)ns;
      SynTypeSimple::SynTypeSimple
                ((SynTypeSimple *)ctx_local,begin,pLVar7,path,stack0xffffffffffffffc8);
    }
  }
  else {
    bVar1 = ParseContext::Consume(ctx,lex_auto);
    if (bVar1) {
      ctx_local = (ParseContext *)ParseContext::get<SynTypeAuto>(ctx);
      pLVar7 = ParseContext::Previous(ctx);
      SynTypeAuto::SynTypeAuto((SynTypeAuto *)ctx_local,begin,pLVar7);
    }
    else {
      bVar1 = ParseContext::Consume(ctx,lex_generic);
      if (bVar1) {
        ctx_local = (ParseContext *)ParseContext::get<SynTypeGeneric>(ctx);
        pLVar7 = ParseContext::Previous(ctx);
        SynTypeGeneric::SynTypeGeneric((SynTypeGeneric *)ctx_local,begin,pLVar7);
      }
      else {
        bVar1 = ParseContext::Consume(ctx,lex_typeof);
        if (bVar1) {
          anon_unknown.dwarf_fc7e::CheckConsume
                    (ctx,lex_oparen,"ERROR: typeof must be followed by \'(\'");
          node = ParseAssignment(ctx);
          if (node == (SynBase *)0x0) {
            pLVar7 = ParseContext::Current(ctx);
            anon_unknown.dwarf_fc7e::Report(ctx,pLVar7,"ERROR: expression not found after typeof(");
            node = &ParseContext::get<SynError>(ctx)->super_SynBase;
            pLVar7 = ParseContext::Current(ctx);
            pLVar8 = ParseContext::Current(ctx);
            SynError::SynError((SynError *)node,pLVar7,pLVar8);
          }
          anon_unknown.dwarf_fc7e::CheckConsume
                    (ctx,lex_cparen,"ERROR: \')\' not found after expression in typeof");
          this_00 = ParseContext::get<SynTypeof>(ctx);
          pLVar7 = ParseContext::Previous(ctx);
          SynTypeof::SynTypeof(this_00,begin,pLVar7,node);
          ctx_local = (ParseContext *)ParsePostExpressions(ctx,&this_00->super_SynBase);
        }
        else {
          bVar1 = ParseContext::Consume(ctx,lex_at);
          if (bVar1) {
            bVar1 = ParseContext::At(ctx,lex_string);
            if (bVar1) {
              name_00 = ParseContext::Consume(ctx);
              pSVar6 = ParseContext::get<SynIdentifier>(ctx);
              pLVar7 = ParseContext::Previous(ctx);
              pLVar8 = ParseContext::Previous(ctx);
              SynIdentifier::SynIdentifier(pSVar6,pLVar7,pLVar8,name_00);
              ctx_local = (ParseContext *)ParseContext::get<SynTypeAlias>(ctx);
              pLVar7 = ParseContext::Previous(ctx);
              SynTypeAlias::SynTypeAlias((SynTypeAlias *)ctx_local,begin,pLVar7,pSVar6);
            }
            else {
              ctx->currentLexeme = begin;
              ctx_local = (ParseContext *)0x0;
            }
          }
          else {
            ctx_local = (ParseContext *)0x0;
          }
        }
      }
    }
  }
  return (SynBase *)ctx_local;
}

Assistant:

SynBase* ParseTerminalType(ParseContext &ctx, bool &shrBorrow)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();

		IntrusiveList<SynIdentifier> namespacePath;

		SynNamespaceElement *ns = NULL;

		while(ctx.At(lex_point) && (ns = ctx.IsNamespace(ns, name)) != NULL)
		{
			ctx.Skip();

			if(!CheckAt(ctx, lex_string, "ERROR: namespace member is expected after '.'"))
			{
				namespacePath.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), name));

				break;
			}

			namespacePath.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), name));

			name = ctx.Consume();
		}

		if(ctx.Consume(lex_less))
		{
			IntrusiveList<SynBase> types;

			SynBase *type = ParseType(ctx, &shrBorrow);

			if(!type)
			{
				if(ctx.Peek() == lex_greater)
					Report(ctx, ctx.Current(), "ERROR: typename required after '<'");

				// Backtrack
				ctx.currentLexeme = start;

				return NULL;
			}

			types.push_back(type);

			while(ctx.Consume(lex_comma))
			{
				type = ParseType(ctx, &shrBorrow);

				if(!type)
				{
					Report(ctx, ctx.Current(), "ERROR: typename required after ','");

					break;
				}

				types.push_back(type);
			}

			bool closed = ctx.Consume(lex_greater);

			if(!closed && ctx.At(lex_shr))
			{
				if(shrBorrow)
					ctx.Skip();

				shrBorrow = !shrBorrow;

				closed = true;
			}

			if(!closed)
			{
				if(types.size() > 1)
				{
					Report(ctx, ctx.Current(), "ERROR: '>' expected after generic type alias list");
				}
				else
				{
					// Backtrack
					ctx.currentLexeme = start;

					return NULL;
				}
			}

			return new (ctx.get<SynTypeGenericInstance>()) SynTypeGenericInstance(start, ctx.Previous(), new (ctx.get<SynTypeSimple>()) SynTypeSimple(start, ctx.Previous(), namespacePath, name), types);
		}

		return new (ctx.get<SynTypeSimple>()) SynTypeSimple(start, ctx.Previous(), namespacePath, name);
	}

	if(ctx.Consume(lex_auto))
		return new (ctx.get<SynTypeAuto>()) SynTypeAuto(start, ctx.Previous());

	if(ctx.Consume(lex_generic))
		return new (ctx.get<SynTypeGeneric>()) SynTypeGeneric(start, ctx.Previous());

	if(ctx.Consume(lex_typeof))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: typeof must be followed by '('");

		SynBase *value = ParseAssignment(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after typeof(");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after expression in typeof");

		SynBase *node = new (ctx.get<SynTypeof>()) SynTypeof(start, ctx.Previous(), value);

		return ParsePostExpressions(ctx, node);
	}

	if(ctx.Consume(lex_at))
	{
		if(!ctx.At(lex_string))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		return new (ctx.get<SynTypeAlias>()) SynTypeAlias(start, ctx.Previous(), nameIdentifier);
	}

	return NULL;
}